

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O1

bool __thiscall mcsFile::VerifySector(mcsFile *this,uchar *data,unsigned_long len)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = 0x10000;
  if (len < 0x10000) {
    uVar5 = len;
  }
  if (len == 0) {
    bVar6 = true;
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      iVar1 = iVar3;
      if (this->curSector[uVar4] != data[uVar4]) {
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Mismatch at address ",0x14);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", file = ",9);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", prom = ",9);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        iVar1 = iVar3 + 1;
        if (8 < iVar3) goto LAB_001099b6;
      }
      uVar4 = uVar4 + 1;
      iVar3 = iVar1;
    } while (uVar5 != uVar4);
    uVar4 = uVar5 & 0xffffffff;
LAB_001099b6:
    iVar3 = (int)uVar4;
    bVar6 = iVar1 == 0;
  }
  return (bool)(iVar3 == (int)uVar5 & bVar6);
}

Assistant:

bool mcsFile::VerifySector(const unsigned char *data, unsigned long len) const
{
    unsigned int lim = (len < sizeof(curSector)) ? len : sizeof(curSector);
    int num = 0;  // number of mismatches
    unsigned int i;
    for (i = 0; i < lim; i++) {
        if (curSector[i] != data[i]) {
            std::cout << std::hex << "Mismatch at address " << startAddr+i
                      << ", file = " << (unsigned int)curSector[i]
                      << ", prom = " << (unsigned int)data[i] << std::endl;
            if (++num >= 10)
                break;
        }
    }
    return (i == lim) && (num == 0);
}